

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCec.c
# Opt level: O2

int Cec_ManVerifyNaive(Gia_Man_t *p,Cec_ParCec_t *pPars)

{
  int *piVar1;
  Cnf_Dat_t *pCVar2;
  Gia_Man_t *pGVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  sat_solver *s;
  Gia_Obj_t *pObj;
  Gia_Obj_t *pObj_00;
  abctime aVar8;
  abctime time;
  uint nItemsCur;
  uint uVar9;
  char *pStr;
  ulong uVar10;
  uint local_8c;
  undefined8 local_78;
  lit local_70;
  uint local_6c;
  ProgressBar *local_68;
  uint local_60;
  uint local_5c;
  abctime local_58;
  Cnf_Dat_t *local_50;
  Gia_Man_t *local_48;
  sat_solver *local_40;
  ulong local_38;
  
  local_50 = Mf_ManGenerateCnf(p,8,0,0,0);
  uVar10 = 1;
  s = (sat_solver *)Cnf_DataWriteIntoSolver(local_50,1,0);
  local_58 = Abc_Clock();
  uVar9 = (p->vCos->nSize - p->nRegs) / 2;
  local_68 = Extra_ProgressBarStart(_stdout,uVar9);
  local_48 = p;
  if ((p->vCos->nSize - p->nRegs & 1U) != 0) {
    __assert_fail("Gia_ManPoNum(p) % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecCec.c"
                  ,0xed,"int Cec_ManVerifyNaive(Gia_Man_t *, Cec_ParCec_t *)");
  }
  local_5c = 0;
  if (0 < (int)uVar9) {
    local_5c = uVar9;
  }
  local_8c = 0;
  local_6c = 0;
  nItemsCur = 0;
  uVar7 = 0;
  uVar4 = 0;
  local_60 = uVar9;
  local_40 = s;
  do {
    if (local_5c == nItemsCur) {
LAB_004b1bae:
      Extra_ProgressBarStop(local_68);
      pStr = (char *)(ulong)uVar4;
      printf("UNSAT = %6d.  SAT = %6d.   UNDEC = %6d.  Trivial = %6d.  ",pStr,(ulong)uVar7,
             (ulong)local_8c,(ulong)local_6c);
      aVar8 = Abc_Clock();
      Abc_PrintTime((int)aVar8 - (int)local_58,pStr,time);
      Cnf_DataFree(local_50);
      sat_solver_delete(s);
      uVar9 = -(uint)(local_8c != 0) | 1;
      if (uVar7 != 0) {
        uVar9 = 0;
      }
      return uVar9;
    }
    if (((char)nItemsCur == '\0') &&
       ((local_68 == (ProgressBar *)0x0 || (local_68->nItemsNext <= (int)nItemsCur)))) {
      Extra_ProgressBarUpdate_int(local_68,nItemsCur,(char *)0x0);
    }
    pGVar3 = local_48;
    pObj = Gia_ManPo(local_48,(int)uVar10 + -1);
    pObj_00 = Gia_ManPo(pGVar3,(int)uVar10);
    if (((ulong)((uint)(*(ulong *)pObj >> 0x1d) & 1) ^
        (ulong)(pObj + -(*(ulong *)pObj & 0x1fffffff))) ==
        ((ulong)((uint)(*(ulong *)pObj_00 >> 0x1d) & 1) ^
        (ulong)(pObj_00 + -(*(ulong *)pObj_00 & 0x1fffffff)))) {
      uVar4 = uVar4 + 1;
      local_6c = local_6c + 1;
LAB_004b1b6d:
      iVar5 = (int)uVar10;
    }
    else {
      if (pPars->TimeLimit != 0) {
        aVar8 = Abc_Clock();
        if ((long)pPars->TimeLimit <= (aVar8 - local_58) / 1000000) {
          printf("Timeout (%d sec) is reached.\n",(long)pPars->TimeLimit,
                 (aVar8 - local_58) % 1000000);
          local_8c = (local_60 - uVar7) - uVar4;
          goto LAB_004b1bae;
        }
      }
      pGVar3 = local_48;
      pCVar2 = local_50;
      piVar1 = local_50->pVarNums;
      local_38 = uVar10;
      iVar5 = Gia_ObjId(local_48,pObj);
      iVar5 = piVar1[iVar5];
      piVar1 = pCVar2->pVarNums;
      iVar6 = Gia_ObjId(pGVar3,pObj_00);
      s = local_40;
      if ((iVar5 < 0) || (piVar1[iVar6] < 0)) {
        __assert_fail("iVar0 >= 0 && iVar1 >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecCec.c"
                      ,0x102,"int Cec_ManVerifyNaive(Gia_Man_t *, Cec_ParCec_t *)");
      }
      local_78 = CONCAT44(piVar1[iVar6] * 2,iVar5 * 2 + 1);
      iVar6 = sat_solver_solve(local_40,(lit *)&local_78,&local_70,(long)pPars->nBTLimit,0,0,0);
      uVar10 = local_38;
      iVar5 = (int)local_38;
      if (iVar6 != 1) {
        if (iVar6 == -1) {
          local_78 = local_78 ^ 0x100000001;
          iVar6 = sat_solver_addclause(s,(lit *)&local_78,&local_70);
          if (iVar6 == 0) {
            __assert_fail("RetValue",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecCec.c"
                          ,0x10d,"int Cec_ManVerifyNaive(Gia_Man_t *, Cec_ParCec_t *)");
          }
          iVar6 = sat_solver_solve(s,(lit *)&local_78,&local_70,(long)pPars->nBTLimit,0,0,0);
          if (iVar6 == 1) goto LAB_004b1b47;
          if (iVar6 == -1) {
            local_78 = local_78 ^ 0x100000001;
            iVar5 = sat_solver_addclause(s,(lit *)&local_78,&local_70);
            if (iVar5 == 0) {
              __assert_fail("RetValue",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecCec.c"
                            ,0x121,"int Cec_ManVerifyNaive(Gia_Man_t *, Cec_ParCec_t *)");
            }
            uVar4 = uVar4 + 1;
            goto LAB_004b1b6d;
          }
        }
        local_8c = local_8c + 1;
        goto LAB_004b1b6d;
      }
LAB_004b1b47:
      printf("Output %d is SAT.\n",(ulong)nItemsCur);
      uVar7 = uVar7 + 1;
    }
    nItemsCur = nItemsCur + 1;
    uVar10 = (ulong)(iVar5 + 2);
  } while( true );
}

Assistant:

int Cec_ManVerifyNaive( Gia_Man_t * p, Cec_ParCec_t * pPars )
{
    extern Cnf_Dat_t * Mf_ManGenerateCnf( Gia_Man_t * pGia, int nLutSize, int fCnfObjIds, int fAddOrCla, int fVerbose );
    Cnf_Dat_t * pCnf = Mf_ManGenerateCnf( p, 8, 0, 0, 0 );
    sat_solver * pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    Gia_Obj_t * pObj0, * pObj1;
    abctime clkStart = Abc_Clock();
    int nPairs = Gia_ManPoNum(p)/2;
    int nUnsats = 0, nSats = 0, nUndecs = 0, nTrivs = 0;
    int i, iVar0, iVar1, pLits[2], status, RetValue;
    ProgressBar * pProgress = Extra_ProgressBarStart( stdout, nPairs );
    assert( Gia_ManPoNum(p) % 2 == 0 );
    for ( i = 0; i < nPairs; i++ )
    {
        if ( (i & 0xFF) == 0 )
            Extra_ProgressBarUpdate( pProgress, i, NULL );
        pObj0 = Gia_ManPo(p, 2*i);
        pObj1 = Gia_ManPo(p, 2*i+1);
        if ( Gia_ObjChild0(pObj0) == Gia_ObjChild0(pObj1) )
        {
            nUnsats++;
            nTrivs++;
            continue;
        }
        if ( pPars->TimeLimit && (Abc_Clock() - clkStart)/CLOCKS_PER_SEC >= pPars->TimeLimit )
        {
            printf( "Timeout (%d sec) is reached.\n", pPars->TimeLimit );
            nUndecs = nPairs - nUnsats - nSats;
            break;
        }
        iVar0 = pCnf->pVarNums[ Gia_ObjId(p, pObj0) ];
        iVar1 = pCnf->pVarNums[ Gia_ObjId(p, pObj1) ];
        assert( iVar0 >= 0 && iVar1 >= 0 );
        pLits[0] = Abc_Var2Lit( iVar0, 0 );
        pLits[1] = Abc_Var2Lit( iVar1, 0 );
        // check direct
        pLits[0] = lit_neg(pLits[0]);
        status = sat_solver_solve( pSat, pLits, pLits + 2, pPars->nBTLimit, 0, 0, 0 );
        if ( status == l_False )
        {
            pLits[0] = lit_neg( pLits[0] );
            pLits[1] = lit_neg( pLits[1] );
            RetValue = sat_solver_addclause( pSat, pLits, pLits + 2 );
            assert( RetValue );
        }
        else if ( status == l_True )
        {
            printf( "Output %d is SAT.\n", i );
            nSats++;
            continue;
        }
        else
        {
            nUndecs++;
            continue;
        }
        // check inverse
        status = sat_solver_solve( pSat, pLits, pLits + 2, pPars->nBTLimit, 0, 0, 0 );
        if ( status == l_False )
        {
            pLits[0] = lit_neg( pLits[0] );
            pLits[1] = lit_neg( pLits[1] );
            RetValue = sat_solver_addclause( pSat, pLits, pLits + 2 );
            assert( RetValue );
        }
        else if ( status == l_True )
        {
            printf( "Output %d is SAT.\n", i );
            nSats++;
            continue;
        }
        else
        {
            nUndecs++;
            continue;
        }
        nUnsats++;
    }
    Extra_ProgressBarStop( pProgress );
    printf( "UNSAT = %6d.  SAT = %6d.   UNDEC = %6d.  Trivial = %6d.  ", nUnsats, nSats, nUndecs, nTrivs );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clkStart );
    Cnf_DataFree( pCnf );
    sat_solver_delete( pSat );
    if ( nSats )
        return 0;
    if ( nUndecs )
        return -1;
    return 1;
}